

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyword_validator.hpp
# Opt level: O1

void __thiscall
jsoncons::jsonschema::
items_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>::
do_validate(items_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
            *this)

{
  json_pointer *in_RCX;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *in_RDX;
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *in_RSI;
  evaluation_results *in_R8;
  error_reporter *in_R9;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *in_stack_00000008;
  
  items_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  ::do_validate((items_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                 *)(this + *(long *)(*(long *)this + -0x38)),in_RSI,in_RDX,in_RCX,in_R8,in_R9,
                in_stack_00000008);
  return;
}

Assistant:

walk_result do_validate(const eval_context<Json>& context, const Json& instance, 
            const jsonpointer::json_pointer& instance_location,
            evaluation_results& results, 
            error_reporter& reporter,
            Json& patch) const final
        {
            if (!instance.is_array())
            {
                return walk_result::advance;
            }

            eval_context<Json> this_context(context, this->keyword_name());

            if (instance.size() > 0 && schema_val_)
            {
                if (schema_val_->always_fails())
                {
                    jsonpointer::json_pointer item_location = instance_location / 0;
                    walk_result result = reporter.error(this->make_validation_message(
                        this_context.eval_path(),
                        item_location, 
                        "Item at index '0' but the schema does not allow any items."));
                    return result;
                }
                else if (schema_val_->always_succeeds())
                {
                    if (context.require_evaluated_items())
                    {
                        results.evaluated_items.insert(range{0,instance.size()});
                    }
                }
                else
                {
                    std::size_t index = 0;
                    std::size_t start = 0;
                    std::size_t end = 0;
                    for (const auto& item : instance.array_range()) 
                    {
                        jsonpointer::json_pointer item_location = instance_location / index;
                        std::size_t errors = reporter.error_count();
                        walk_result result = schema_val_->validate(this_context, item, item_location, results, reporter, patch);
                        if (result == walk_result::abort)
                        {
                            return result;
                        }
                        if (errors == reporter.error_count())
                        {
                            if (context.require_evaluated_items())
                            {
                                if (end == start)
                                {
                                    start = end = index;
                                }
                                ++end;
                            }
                        }
                        else
                        {
                            if (start < end)
                            {
                                results.evaluated_items.insert(range{start, end});
                                start = end;
                            }
                        }
                        ++index;
                    }
                    if (start < end)
                    {
                        results.evaluated_items.insert(range{start, end});
                        start = end;
                    }
                }
            }
            return walk_result::advance;
        }